

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O0

void __thiscall Am_Drawonable_Impl::Allocate_Closest_Color(Am_Drawonable_Impl *this,XColor *c)

{
  unsigned_long uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  ulong uVar5;
  void *pvVar6;
  ostream *poVar7;
  void *this_00;
  unsigned_long *puVar8;
  float fVar9;
  float local_94;
  int local_90;
  float min_error;
  int index_of_min;
  float e;
  XColor *colors;
  int i;
  int n_colors;
  XVisualInfo *vi;
  undefined1 local_68 [4];
  int n;
  XVisualInfo vit;
  VisualID vid;
  Visual *V;
  XColor *c_local;
  Am_Drawonable_Impl *this_local;
  
  iVar3 = XAllocColor(this->screen->display,this->screen->colormap,c);
  if (iVar3 == 0) {
    if (Allocate_Closest_Color::flag == 0) {
      std::operator<<((ostream *)&std::cerr,"** No color cells left; using closest match.\n");
      Allocate_Closest_Color::flag = 1;
    }
    vit.visual = (Visual *)
                 XVisualIDFromVisual(*(undefined8 *)
                                      (*(long *)(this->screen->display + 0xe8) +
                                       (long)this->screen->screen_number * 0x80 + 0x40));
    vit._56_8_ = vit.visual;
    lVar4 = XGetVisualInfo(this->screen->display,1,local_68,(long)&vi + 4);
    if (vi._4_4_ == 0) {
      std::operator<<((ostream *)&std::cerr,
                      "** X Error finding closest color match.  Using Black instead.\n");
      XFree(lVar4);
      Paint_It_Black(c,this->screen->display,this->screen->colormap);
    }
    else {
      iVar3 = *(int *)(lVar4 + 0x38);
      XFree(lVar4);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)iVar3;
      uVar5 = SUB168(auVar2 * ZEXT816(0x10),0);
      if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pvVar6 = operator_new__(uVar5);
      for (colors._0_4_ = 0; (int)colors < iVar3; colors._0_4_ = (int)colors + 1) {
        *(long *)((long)pvVar6 + (long)(int)colors * 0x10) = (long)(int)colors;
      }
      XQueryColors(this->screen->display,this->screen->colormap,pvVar6,iVar3);
      local_90 = 0;
      local_94 = color_error((uint)c->red,(uint)*(ushort *)((long)pvVar6 + 8),(uint)c->green,
                             (uint)*(ushort *)((long)pvVar6 + 10),(uint)c->blue,
                             (uint)*(ushort *)((long)pvVar6 + 0xc));
      for (colors._0_4_ = 1; (int)colors < iVar3; colors._0_4_ = (int)colors + 1) {
        fVar9 = color_error((uint)c->red,
                            (uint)*(ushort *)((long)pvVar6 + (long)(int)colors * 0x10 + 8),
                            (uint)c->green,
                            (uint)*(ushort *)((long)pvVar6 + (long)(int)colors * 0x10 + 10),
                            (uint)c->blue,
                            (uint)*(ushort *)((long)pvVar6 + (long)(int)colors * 0x10 + 0xc));
        if (fVar9 < local_94) {
          local_90 = (int)colors;
          local_94 = fVar9;
        }
      }
      poVar7 = std::operator<<((ostream *)&std::cerr,"   Wanted r");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,c->red);
      poVar7 = std::operator<<(poVar7,", g");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,c->green);
      poVar7 = std::operator<<(poVar7,", b");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,c->blue);
      std::operator<<(poVar7,"\n");
      poVar7 = std::operator<<((ostream *)&std::cerr,"   got    r");
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,*(ushort *)((long)pvVar6 + (long)local_90 * 0x10 + 8));
      poVar7 = std::operator<<(poVar7,", g");
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,*(ushort *)((long)pvVar6 + (long)local_90 * 0x10 + 10));
      poVar7 = std::operator<<(poVar7,", b");
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,*(ushort *)((long)pvVar6 + (long)local_90 * 0x10 + 0xc));
      std::operator<<(poVar7,"\n");
      fVar9 = color_error((uint)c->red,(uint)*(ushort *)((long)pvVar6 + (long)local_90 * 0x10 + 8),
                          (uint)c->green,
                          (uint)*(ushort *)((long)pvVar6 + (long)local_90 * 0x10 + 10),(uint)c->blue
                          ,(uint)*(ushort *)((long)pvVar6 + (long)local_90 * 0x10 + 0xc));
      poVar7 = std::operator<<((ostream *)&std::cerr,"  Error = ");
      std::ostream::operator<<(poVar7,fVar9);
      color_error((uint)c->red,(uint)*(ushort *)((long)pvVar6 + (long)(int)colors * 0x10 + 8),
                  (uint)c->green,(uint)*(ushort *)((long)pvVar6 + (long)(int)colors * 0x10 + 10),
                  (uint)c->blue,(uint)*(ushort *)((long)pvVar6 + (long)(int)colors * 0x10 + 0xc));
      poVar7 = std::operator<<((ostream *)&std::cerr," error with cell i = ");
      this_00 = (void *)std::ostream::operator<<(poVar7,local_90);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      iVar3 = XAllocColor(this->screen->display,this->screen->colormap,
                          (void *)((long)pvVar6 + (long)local_90 * 0x10));
      if (iVar3 == 0) {
        Paint_It_Black(c,this->screen->display,this->screen->colormap);
      }
      else {
        puVar8 = (unsigned_long *)((long)pvVar6 + (long)local_90 * 0x10);
        c->pixel = *puVar8;
        uVar1 = puVar8[1];
        c->red = (short)uVar1;
        c->green = (short)(uVar1 >> 0x10);
        c->blue = (short)(uVar1 >> 0x20);
        c->flags = (char)(uVar1 >> 0x30);
        c->pad = (char)(uVar1 >> 0x38);
      }
      if (pvVar6 != (void *)0x0) {
        operator_delete__(pvVar6);
      }
    }
  }
  return;
}

Assistant:

void
Am_Drawonable_Impl::Allocate_Closest_Color(XColor &c) const
{
  // if we have a match, do no work.
  if (XAllocColor(screen->display, screen->colormap, &c))
    return;

  static int flag = 0;
  if (!flag) {
    std::cerr << "** No color cells left; using closest match.\n";
    flag = 1;
  }

  // X manual claims that the following 7 or so lines of code are only
  // slightly less convenient than just using "V->colormap_size" which
  // isn't allowed in case they change the Visual structure.  Crap.
  Visual *V = DefaultVisual(screen->display, screen->screen_number);
  VisualID vid = XVisualIDFromVisual(V);
  XVisualInfo vit; // template
  vit.visualid = vid;
  int n;
  XVisualInfo *vi = XGetVisualInfo(screen->display, VisualIDMask, &vit, &n);
  if (n == 0) {
    std::cerr
        << "** X Error finding closest color match.  Using Black instead.\n";
    XFree(vi);
    Paint_It_Black(c, screen->display, screen->colormap);
    return;
  }
  int n_colors = vi->colormap_size;
  XFree(vi);

  int i;
  XColor *colors = new XColor[n_colors];
  // fill the array with pixel values we want the rgb's for.
  for (i = 0; i < n_colors; i++)
    colors[i].pixel = i;
  XQueryColors(screen->display, screen->colormap, colors, n_colors);
#if defined(_M_UNIX)
  float *ecolors = new float[n_colors];
  // Compute error colors for color table
  for (i = 0; i < n_colors; i++)
    ecolors[i] = color_error(c.red, colors[i].red, c.green, colors[i].green,
                             c.blue, colors[i].blue);
  // Sort array by base in error color
  for (i = 0; i < n_colors; i++) {
    int j;
    for (j = i + 1; j < n_colors; j++)
      if (ecolors[i] > ecolors[j]) {
        float t = ecolors[i];
        ecolors[i] = ecolors[j];
        ecolors[j] = t;
        XColor ct = colors[i];
        colors[i] = colors[j];
        colors[j] = ct;
      }
    if (XAllocColor(screen->display, screen->colormap, &colors[i])) {
      c = colors[i];
      delete[] ecolors;
      delete[] colors;
      return;
    }
  }
  Paint_It_Black(c, screen->display, screen->colormap);
  delete[] ecolors;
  delete[] colors;
#else
  float e;
  int index_of_min = 0;
  float min_error =
      color_error(c.red, colors[0].red, c.green, colors[0].green, c.blue,
                  colors[0].blue); // so we don't recalculate
  for (i = 1; i < n_colors; i++) { // skip cell 0: default values.
    e = color_error(c.red, colors[i].red, c.green, colors[i].green, c.blue,
                    colors[i].blue);
    if (e < min_error) {
      index_of_min = i;
      min_error = e;
    }
  }
  std::cerr << "   Wanted r" << c.red << ", g" << c.green << ", b" << c.blue
            << "\n";
  std::cerr << "   got    r" << colors[index_of_min].red << ", g"
            << colors[index_of_min].green << ", b" << colors[index_of_min].blue
            << "\n";
  e = color_error(c.red, colors[index_of_min].red, c.green,
                  colors[index_of_min].green, c.blue,
                  colors[index_of_min].blue);
  std::cerr << "  Error = " << e;
  e = color_error(c.red, colors[i].red, c.green, colors[i].green, c.blue,
                  colors[i].blue);
  std::cerr << " error with cell i = " << index_of_min << std::endl;
  if (XAllocColor(screen->display, screen->colormap, &colors[index_of_min]))
    c = colors[index_of_min];
  else
    Paint_It_Black(c, screen->display, screen->colormap);
  delete[] colors;
#endif
}